

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

wchar_t edit_pathname(bsdtar *bsdtar,archive_entry *entry)

{
  archive_entry *bsdtar_00;
  int iVar1;
  char *pcVar2;
  bool bVar3;
  char *pcStack_48;
  wchar_t r;
  char *subst_name;
  char *original_hardlinkname;
  char *hardlinkname;
  char *original_name;
  char *name;
  archive_entry *entry_local;
  bsdtar *bsdtar_local;
  
  name = (char *)entry;
  entry_local = (archive_entry *)bsdtar;
  hardlinkname = archive_entry_pathname(entry);
  original_name = hardlinkname;
  subst_name = archive_entry_hardlink((archive_entry *)name);
  original_hardlinkname = subst_name;
  iVar1 = apply_substitution((bsdtar *)entry_local,original_name,&stack0xffffffffffffffb8,0,0);
  if (iVar1 == -1) {
    lafe_warnc(0,"Invalid substitution, skipping entry");
    return L'\x01';
  }
  if (iVar1 == 1) {
    archive_entry_copy_pathname((archive_entry *)name,pcStack_48);
    if (*pcStack_48 == '\0') {
      free(pcStack_48);
      return L'\xffffffff';
    }
    free(pcStack_48);
    hardlinkname = archive_entry_pathname((archive_entry *)name);
    original_name = hardlinkname;
  }
  if (original_hardlinkname != (char *)0x0) {
    iVar1 = apply_substitution((bsdtar *)entry_local,original_hardlinkname,&stack0xffffffffffffffb8,
                               0,1);
    if (iVar1 == -1) {
      lafe_warnc(0,"Invalid substitution, skipping entry");
      return L'\x01';
    }
    if (iVar1 == 1) {
      archive_entry_copy_hardlink((archive_entry *)name,pcStack_48);
      free(pcStack_48);
    }
    subst_name = archive_entry_hardlink((archive_entry *)name);
    original_hardlinkname = subst_name;
  }
  pcVar2 = archive_entry_symlink((archive_entry *)name);
  bsdtar_00 = entry_local;
  if (pcVar2 != (char *)0x0) {
    pcVar2 = archive_entry_symlink((archive_entry *)name);
    iVar1 = apply_substitution((bsdtar *)bsdtar_00,pcVar2,&stack0xffffffffffffffb8,1,0);
    if (iVar1 == -1) {
      lafe_warnc(0,"Invalid substitution, skipping entry");
      return L'\x01';
    }
    if (iVar1 == 1) {
      archive_entry_copy_symlink((archive_entry *)name,pcStack_48);
      free(pcStack_48);
    }
  }
  if (0 < (int)(entry_local->ae_stat).aest_ctime_nsec) {
    original_name = strip_components(original_name,(entry_local->ae_stat).aest_ctime_nsec);
    if (original_name == (char *)0x0) {
      return L'\x01';
    }
    if ((original_hardlinkname != (char *)0x0) &&
       (original_hardlinkname =
             strip_components(original_hardlinkname,(entry_local->ae_stat).aest_ctime_nsec),
       original_hardlinkname == (char *)0x0)) {
      return L'\x01';
    }
  }
  if ((*(uint *)&(entry_local->ae_stat).field_0xc & 2) == 0) {
    original_name = strip_absolute_path((bsdtar *)entry_local,original_name);
    if (*original_name == '\0') {
      original_name = ".";
    }
    if ((original_hardlinkname != (char *)0x0) &&
       (original_hardlinkname = strip_absolute_path((bsdtar *)entry_local,original_hardlinkname),
       *original_hardlinkname == '\0')) {
      return L'\x01';
    }
  }
  else {
    while( true ) {
      bVar3 = false;
      if (*original_name == '/') {
        bVar3 = original_name[1] == '/';
      }
      if (!bVar3) break;
      original_name = original_name + 1;
    }
  }
  if (original_name != hardlinkname) {
    archive_entry_copy_pathname((archive_entry *)name,original_name);
  }
  if (original_hardlinkname != subst_name) {
    archive_entry_copy_hardlink((archive_entry *)name,original_hardlinkname);
  }
  return L'\0';
}

Assistant:

int
edit_pathname(struct bsdtar *bsdtar, struct archive_entry *entry)
{
	const char *name = archive_entry_pathname(entry);
	const char *original_name = name;
	const char *hardlinkname = archive_entry_hardlink(entry);
	const char *original_hardlinkname = hardlinkname;
#if defined(HAVE_REGEX_H) || defined(HAVE_PCREPOSIX_H) || defined(HAVE_PCRE2POSIX_H)
	char *subst_name;
	int r;

	/* Apply user-specified substitution to pathname. */
	r = apply_substitution(bsdtar, name, &subst_name, 0, 0);
	if (r == -1) {
		lafe_warnc(0, "Invalid substitution, skipping entry");
		return 1;
	}
	if (r == 1) {
		archive_entry_copy_pathname(entry, subst_name);
		if (*subst_name == '\0') {
			free(subst_name);
			return -1;
		} else
			free(subst_name);
		name = archive_entry_pathname(entry);
		original_name = name;
	}

	/* Apply user-specified substitution to hardlink target. */
	if (hardlinkname != NULL) {
		r = apply_substitution(bsdtar, hardlinkname, &subst_name, 0, 1);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_hardlink(entry, subst_name);
			free(subst_name);
		}
		hardlinkname = archive_entry_hardlink(entry);
		original_hardlinkname = hardlinkname;
	}

	/* Apply user-specified substitution to symlink body. */
	if (archive_entry_symlink(entry) != NULL) {
		r = apply_substitution(bsdtar, archive_entry_symlink(entry), &subst_name, 1, 0);
		if (r == -1) {
			lafe_warnc(0, "Invalid substitution, skipping entry");
			return 1;
		}
		if (r == 1) {
			archive_entry_copy_symlink(entry, subst_name);
			free(subst_name);
		}
	}
#endif

	/* Strip leading dir names as per --strip-components option. */
	if (bsdtar->strip_components > 0) {
		name = strip_components(name, bsdtar->strip_components);
		if (name == NULL)
			return (1);

		if (hardlinkname != NULL) {
			hardlinkname = strip_components(hardlinkname,
			    bsdtar->strip_components);
			if (hardlinkname == NULL)
				return (1);
		}
	}

	if ((bsdtar->flags & OPTFLAG_ABSOLUTE_PATHS) == 0) {
		/* By default, don't write or restore absolute pathnames. */
		name = strip_absolute_path(bsdtar, name);
		if (*name == '\0')
			name = ".";

		if (hardlinkname != NULL) {
			hardlinkname = strip_absolute_path(bsdtar, hardlinkname);
			if (*hardlinkname == '\0')
				return (1);
		}
	} else {
		/* Strip redundant leading '/' characters. */
		while (name[0] == '/' && name[1] == '/')
			name++;
	}

	/* Replace name in archive_entry. */
	if (name != original_name) {
		archive_entry_copy_pathname(entry, name);
	}
	if (hardlinkname != original_hardlinkname) {
		archive_entry_copy_hardlink(entry, hardlinkname);
	}
	return (0);
}